

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

bool slang::ast::unpackConcatenation
               (StreamingConcatenationExpression *lhs,PackIterator *iter,PackIterator iterEnd,
               uint64_t *bitOffset,uint64_t *dynamicSize,EvalContext *context,
               SmallVectorBase<slang::ConstantValue> *dryRun)

{
  size_t sVar1;
  pointer pSVar2;
  StreamingConcatenationExpression *lhs_00;
  Type *type;
  Expression *this;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  Type *pTVar7;
  ulong bitstreamWidth;
  uint64_t uVar8;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar9;
  size_t sVar10;
  uint64_t uVar11;
  int iVar12;
  char cVar13;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *this_00;
  int iVar14;
  EVP_PKEY_CTX *ctx;
  __extent_storage<18446744073709551615UL> _Var15;
  long lVar16;
  int iVar17;
  span<slang::ConstantValue,_18446744073709551615UL> elems;
  optional<slang::ConstantRange> oVar19;
  ConstantValue oldValue;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  uint64_t bit;
  const_iterator iterConcat;
  ConstantValue rvalue;
  uint64_t dynamicSizeSave;
  SmallVector<slang::ConstantValue,_2UL> toBeOrdered;
  bool local_2e1;
  _Storage<slang::ConstantRange,_true> local_2e0;
  ulong local_2d0;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_298;
  char local_278;
  undefined1 local_268 [32];
  __index_type local_248;
  long local_228;
  uint64_t local_220;
  ConstantValue *local_218;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_210;
  uint64_t local_1e8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_1e0;
  undefined1 local_1b8 [384];
  __index_type local_38;
  ulong uVar18;
  
  sVar1 = (lhs->streams_)._M_extent._M_extent_value;
  local_2e1 = sVar1 == 0;
  if (!local_2e1) {
    pSVar2 = (lhs->streams_)._M_ptr;
    local_228 = sVar1 * 0x18;
    lVar16 = 0;
    do {
      lhs_00 = *(StreamingConcatenationExpression **)((long)&(pSVar2->operand).ptr + lVar16);
      if ((lhs_00->super_Expression).kind == Streaming) {
        if ((dryRun == (SmallVectorBase<slang::ConstantValue> *)0x0) && (lhs_00->sliceSize != 0)) {
          local_1e8 = *dynamicSize;
          local_1b8._0_8_ = local_1b8 + 0x18;
          local_1b8._8_8_ = 0;
          local_1b8._16_8_ = 2;
          ctx = (EVP_PKEY_CTX *)iter;
          bVar6 = unpackConcatenation(lhs_00,iter,iterEnd,bitOffset,dynamicSize,context,
                                      (SmallVectorBase<slang::ConstantValue> *)local_1b8);
          cVar13 = true;
          if (bVar6) {
            std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
            vector<slang::ConstantValue*,void>
                      ((vector<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)
                       local_268,(ConstantValue *)local_1b8._0_8_,
                       (ConstantValue *)(local_1b8._0_8_ + local_1b8._8_8_ * 0x28),
                       (allocator_type *)&local_210);
            local_298._0_8_ = local_268._0_8_;
            local_298._8_8_ = local_268._8_8_;
            local_298._16_8_ = local_268._16_8_;
            local_268._0_8_ = (ConstantValue *)0x0;
            local_268._8_8_ = 0;
            local_268._16_8_ = 0;
            local_278 = '\x05';
            std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                      ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       local_268);
            uVar8 = ConstantValue::getBitstreamWidth((ConstantValue *)&local_298);
            Bitstream::reOrder((ConstantValue *)&local_210,(ConstantValue *)&local_298,
                               lhs_00->sliceSize,uVar8);
            local_268._0_8_ = local_268 + 0x18;
            local_268._8_8_ = 0;
            local_268._16_8_ = 5;
            packBitstream((ConstantValue *)&local_210,
                          (SmallVectorBase<slang::ConstantValue_*> *)local_268);
            local_218 = (ConstantValue *)local_268._0_8_;
            local_220 = 0;
            ctx = (EVP_PKEY_CTX *)&local_218;
            bVar6 = unpackConcatenation(lhs_00,(PackIterator *)ctx,
                                        (PackIterator)(local_268._0_8_ + local_268._8_8_ * 8),
                                        &local_220,&local_1e8,context,
                                        (SmallVectorBase<slang::ConstantValue> *)0x0);
            if ((ConstantValue *)local_268._0_8_ != (ConstantValue *)(local_268 + 0x18)) {
              operator_delete((void *)local_268._0_8_);
            }
            cVar13 = !bVar6;
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&local_210);
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&local_298);
          }
          SmallVectorBase<slang::ConstantValue>::cleanup
                    ((SmallVectorBase<slang::ConstantValue> *)local_1b8,ctx);
        }
        else {
          bVar6 = unpackConcatenation(lhs_00,iter,iterEnd,bitOffset,dynamicSize,context,dryRun);
          cVar13 = bVar6 * '\x02' + '\x01';
        }
      }
      else {
        type = (lhs_00->super_Expression).type.ptr;
        local_248 = '\0';
        this = *(Expression **)((long)&pSVar2->withExpr + lVar16);
        _Var15._M_extent_value = (size_t)bitOffset;
        if (this == (Expression *)0x0) {
          unpackBitstream((ConstantValue *)local_1b8,type,iter,iterEnd,bitOffset,dynamicSize);
          local_298._0_8_ = local_268;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
            ::_S_vtable._M_arr[(long)(char)local_1b8[0x20] + 1]._M_data)
                    ((anon_class_8_1_8991fb9c *)&local_298,
                     (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      *)local_1b8);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)local_1b8);
          local_2e0 = (_Storage<slang::ConstantRange,_true>)0x0;
          local_2d0 = 0;
LAB_002dd53d:
          if (dryRun == (SmallVectorBase<slang::ConstantValue> *)0x0) {
            Expression::evalLValue((LValue *)local_1b8,&lhs_00->super_Expression,context);
            if (local_38 == '\0') {
              cVar13 = '\x01';
            }
            else {
              if (*(long *)((long)&pSVar2->withExpr + lVar16) != 0) {
                if (local_2e0._0_4_ != (int)local_2d0) {
                  if (type->canonical == (Type *)0x0) {
                    Type::resolveCanonical(type);
                  }
                  if (((type->canonical->super_Symbol).kind == QueueType) && (local_248 != '\b')) {
                    pvVar9 = std::
                             get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                       ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                         *)local_268);
                    pTVar7 = (Type *)(pvVar9->
                                     super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                     )._M_impl.super__Vector_impl_data._M_start;
                    elems._M_ptr = (pointer)(((long)(pvVar9->
                                                  super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                              (long)pTVar7 >> 3) * -0x3333333333333333);
                    elems._M_extent._M_extent_value = _Var15._M_extent_value;
                    constContainer((ConstantValue *)&local_298,(ast *)type,pTVar7,elems);
                    local_210._0_8_ =
                         (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          *)local_268;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                      ::_S_vtable._M_arr[(long)local_278 + 1]._M_data)
                              ((anon_class_8_1_8991fb9c *)&local_210,
                               (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                *)&local_298);
                    std::__detail::__variant::
                    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                         *)&local_298);
                  }
                }
                pTVar7 = Type::getArrayElementType(type);
                bVar6 = Type::hasFixedRange(type);
                if (!bVar6) {
                  LValue::load((ConstantValue *)&local_298,(LValue *)local_1b8);
                  sVar10 = ConstantValue::size((ConstantValue *)&local_298);
                  if (sVar10 <= local_2d0) {
                    Type::getDefaultValue((ConstantValue *)&local_1e0,pTVar7);
                    Bitstream::resizeToRange
                              ((ConstantValue *)&local_210,(ConstantValue *)&local_298,
                               (ConstantRange)(local_2d0 << 0x20),(ConstantValue *)&local_1e0,true);
                    std::__detail::__variant::
                    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    ::~_Variant_storage(&local_1e0);
                    LValue::store((LValue *)local_1b8,(ConstantValue *)&local_210);
                    std::__detail::__variant::
                    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                         *)&local_210);
                  }
                  std::__detail::__variant::
                  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                       *)&local_298);
                }
                if (local_2e0._0_4_ == (int)local_2d0) {
                  Type::getDefaultValue((ConstantValue *)&local_298,pTVar7);
                  LValue::addIndex((LValue *)local_1b8,local_2e0._0_4_,(ConstantValue *)&local_298);
                }
                else {
                  Type::getDefaultValue((ConstantValue *)&local_298,pTVar7);
                  LValue::addArraySlice
                            ((LValue *)local_1b8,
                             (ConstantRange)((ulong)local_2e0 & 0xffffffff | local_2d0 << 0x20),
                             (ConstantValue *)&local_298);
                }
                std::__detail::__variant::
                _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                     *)&local_298);
              }
              cVar13 = '\0';
              LValue::store((LValue *)local_1b8,(ConstantValue *)local_268);
            }
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
                                 *)local_1b8);
          }
          else {
            cVar13 = '\x03';
            SmallVectorBase<slang::ConstantValue>::emplace_back<slang::ConstantValue>
                      (dryRun,(ConstantValue *)local_268);
          }
        }
        else {
          oVar19 = Expression::evalSelector(this,context,false);
          local_2e0 = oVar19.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                      super__Optional_payload_base<slang::ConstantRange>._M_payload;
          cVar13 = '\x01';
          if (((undefined1  [12])
               oVar19.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) !=
              (undefined1  [12])0x0) {
            pTVar7 = Type::getArrayElementType(type);
            uVar8 = Type::getBitstreamWidth(pTVar7);
            local_2d0 = (ulong)local_2e0 >> 0x20;
            iVar14 = oVar19.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::ConstantRange>._M_payload._4_4_;
            iVar12 = oVar19.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                     super__Optional_payload_base<slang::ConstantRange>._M_payload._0_4_;
            iVar17 = iVar12 - iVar14;
            if (iVar12 <= iVar14) {
              iVar17 = iVar14 - iVar12;
            }
            uVar18 = CONCAT44(0,iVar17 + 1);
            auVar4._8_8_ = 0;
            auVar4._0_8_ = uVar8;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = uVar18;
            bitstreamWidth = SUB168(auVar4 * auVar5,0);
            bVar6 = SUB168(auVar4 * auVar5,8) != 0;
            if ((bool)(~bVar6 & bitstreamWidth < 0x3fffffff9)) {
              uVar3 = *dynamicSize;
              if ((uVar3 != 0) &&
                 ((&(pSVar2->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>.
                    _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged)[lVar16] ==
                  false)) {
                uVar11 = uVar3 - bitstreamWidth;
                uVar8 = 0;
                if (bitstreamWidth <= uVar3 && uVar11 != 0) {
                  uVar8 = uVar11;
                }
                if (bVar6) {
                  uVar8 = uVar11;
                }
                *dynamicSize = uVar8;
              }
              if (iVar12 == iVar14) {
                this_00 = (_Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)local_1b8;
                unpackBitstream((ConstantValue *)this_00,pTVar7,iter,iterEnd,bitOffset,dynamicSize);
                local_298._0_8_ = local_268;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                  ::_S_vtable._M_arr[(long)(char)local_1b8[0x20] + 1]._M_data)
                          ((anon_class_8_1_8991fb9c *)&local_298,
                           (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            *)this_00);
              }
              else {
                uVar8 = Type::getSelectableWidth(pTVar7);
                FixedSizeUnpackedArrayType::FixedSizeUnpackedArrayType
                          ((FixedSizeUnpackedArrayType *)local_1b8,pTVar7,local_2e0._M_value,
                           uVar8 * uVar18,bitstreamWidth);
                this_00 = &local_298;
                unpackBitstream((ConstantValue *)this_00,(Type *)local_1b8,iter,iterEnd,bitOffset,
                                dynamicSize);
                local_210._0_8_ = local_268;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                  ::_S_vtable._M_arr[(long)local_278 + 1]._M_data)
                          ((anon_class_8_1_8991fb9c *)&local_210,
                           (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            *)this_00);
              }
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)this_00);
              goto LAB_002dd53d;
            }
            EvalContext::addDiag
                      (context,(DiagCode)0x180009,
                       *(SourceRange *)(*(long *)((long)&pSVar2->withExpr + lVar16) + 0x20));
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)local_268);
      }
      if (cVar13 == '\0') {
        cVar13 = '\0';
      }
      if ((cVar13 != '\x03') && (cVar13 != '\0')) {
        return local_2e1;
      }
      lVar16 = lVar16 + 0x18;
      local_2e1 = local_228 == lVar16;
    } while (!local_2e1);
  }
  return local_2e1;
}

Assistant:

static bool unpackConcatenation(const StreamingConcatenationExpression& lhs, PackIterator& iter,
                                const PackIterator iterEnd, uint64_t& bitOffset,
                                uint64_t& dynamicSize, EvalContext& context,
                                SmallVectorBase<ConstantValue>* dryRun = nullptr) {
    for (auto& stream : lhs.streams()) {
        auto& operand = *stream.operand;
        if (operand.kind == ExpressionKind::Streaming) {
            auto& concat = operand.as<StreamingConcatenationExpression>();
            if (dryRun || !concat.getSliceSize()) {
                if (!unpackConcatenation(concat, iter, iterEnd, bitOffset, dynamicSize, context,
                                         dryRun)) {
                    return false;
                }
                continue;
            }

            // A dry run collects rvalue without storing lvalue
            uint64_t dynamicSizeSave = dynamicSize;
            SmallVector<ConstantValue> toBeOrdered;
            if (!unpackConcatenation(concat, iter, iterEnd, bitOffset, dynamicSize, context,
                                     &toBeOrdered)) {
                return false;
            }

            // Re-order to a new rvalue with the slice size
            ConstantValue cv = std::vector(toBeOrdered.begin(), toBeOrdered.end());
            uint64_t streamWidth = cv.getBitstreamWidth();
            auto rvalue = Bitstream::reOrder(std::move(cv), concat.getSliceSize(), streamWidth);

            SmallVector<ConstantValue*> packed;
            packBitstream(rvalue, packed);

            // A real pass stores lvalue from new rvalue
            auto iterConcat = std::cbegin(packed);
            uint64_t bit = 0;
            if (!unpackConcatenation(concat, iterConcat, std::cend(packed), bit, dynamicSizeSave,
                                     context)) {
                return false;
            }

            SLANG_ASSERT(dynamicSizeSave == dynamicSize);
            SLANG_ASSERT(iterConcat == std::cend(packed) && !bit);
        }
        else {
            auto& arrayType = *operand.type;
            ConstantRange with;
            ConstantValue rvalue;
            if (stream.withExpr) {
                auto range = stream.withExpr->evalSelector(context, /* enforceBounds */ false);
                if (!range)
                    return false;

                with = *range;

                auto elemType = arrayType.getArrayElementType();
                SLANG_ASSERT(elemType);

                auto withSize = checkedMulU64(elemType->getBitstreamWidth(), with.width());
                if (!withSize || withSize > Type::MaxBitWidth) {
                    context.addDiag(diag::ObjectTooLarge, stream.withExpr->sourceRange);
                    return false;
                }

                if (dynamicSize > 0 && !stream.constantWithWidth) {
                    if (withSize >= dynamicSize)
                        dynamicSize = 0;
                    else
                        dynamicSize -= *withSize;
                }

                if (with.left == with.right) {
                    rvalue = unpackBitstream(*elemType, iter, iterEnd, bitOffset, dynamicSize);
                }
                else {
                    // We already checked for overflow earlier so it's fine to create this
                    // temporary array result type as-is.
                    FixedSizeUnpackedArrayType rvalueType(
                        *elemType, with, elemType->getSelectableWidth() * with.width(), *withSize);

                    rvalue = unpackBitstream(rvalueType, iter, iterEnd, bitOffset, dynamicSize);
                }
            }
            else {
                rvalue = unpackBitstream(arrayType, iter, iterEnd, bitOffset, dynamicSize);
            }

            if (dryRun) {
                dryRun->emplace_back(std::move(rvalue));
                continue;
            }

            LValue lvalue = operand.evalLValue(context);
            if (!lvalue)
                return false;

            if (stream.withExpr) {
                if (with.left != with.right && arrayType.isQueue() && !rvalue.isQueue())
                    rvalue = constContainer(arrayType, rvalue.elements());

                auto elemType = arrayType.getArrayElementType();
                if (!arrayType.hasFixedRange()) {
                    // When the array is a variable-size array, it shall be resized to
                    // accommodate the range expression.
                    SLANG_ASSERT(with.left <= with.right);
                    auto oldValue = lvalue.load();
                    if (oldValue.size() <= static_cast<uint32_t>(with.right)) {
                        auto newValue = Bitstream::resizeToRange(std::move(oldValue),
                                                                 {0, with.right},
                                                                 elemType->getDefaultValue(), true);
                        lvalue.store(newValue);
                    }
                }

                if (with.left == with.right)
                    lvalue.addIndex(with.left, elemType->getDefaultValue());
                else
                    lvalue.addArraySlice(with, elemType->getDefaultValue());
            }

            lvalue.store(rvalue);
        }
    }

    return true;
}